

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void ImGui::SetNextWindowSize(ImVec2 *size,ImGuiCond cond)

{
  ImGuiContext *pIVar1;
  int in_ESI;
  ImVec2 *in_RDI;
  ImGuiContext *g;
  ImGuiCond local_20;
  bool local_19;
  
  pIVar1 = GImGui;
  local_19 = true;
  if (in_ESI != 0) {
    local_19 = ImIsPowerOfTwo(in_ESI);
  }
  if (local_19 != false) {
    (pIVar1->NextWindowData).Flags = (pIVar1->NextWindowData).Flags | 2;
    (pIVar1->NextWindowData).SizeVal = *in_RDI;
    local_20 = in_ESI;
    if (in_ESI == 0) {
      local_20 = 1;
    }
    (pIVar1->NextWindowData).SizeCond = local_20;
    return;
  }
  __assert_fail("cond == 0 || ImIsPowerOfTwo(cond)",
                "/workspace/llm4binary/github/license_all_cmakelists_25/aatifjiwani[P]lens-flare/src/imgui/imgui.cpp"
                ,0x1a7c,"void ImGui::SetNextWindowSize(const ImVec2 &, ImGuiCond)");
}

Assistant:

void ImGui::SetNextWindowSize(const ImVec2& size, ImGuiCond cond)
{
    ImGuiContext& g = *GImGui;
    IM_ASSERT(cond == 0 || ImIsPowerOfTwo(cond)); // Make sure the user doesn't attempt to combine multiple condition flags.
    g.NextWindowData.Flags |= ImGuiNextWindowDataFlags_HasSize;
    g.NextWindowData.SizeVal = size;
    g.NextWindowData.SizeCond = cond ? cond : ImGuiCond_Always;
}